

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

bool __thiscall
chaiscript::dispatch::Bound_Function::call_match
          (Bound_Function *this,Function_Params *vals,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  int iVar2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_40;
  pointer local_28;
  pointer local_20;
  
  peVar1 = (this->m_f).
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  build_param_list(&local_40,this,vals);
  local_28 = local_40.
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (local_40.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_40.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_28 = (pointer)0x0;
  }
  local_20 = local_40.
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_40.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_40.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_20 = (pointer)0x0;
  }
  iVar2 = (*peVar1->_vptr_Proxy_Function_Base[3])(peVar1,&local_28,t_conversions);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_40)
  ;
  return SUB41(iVar2,0);
}

Assistant:

bool call_match(const Function_Params &vals, const Type_Conversions_State &t_conversions) const override {
        return m_f->call_match(Function_Params(build_param_list(vals)), t_conversions);
      }